

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O2

linepart __thiscall
mpt::layout::graph::transform3::part(transform3 *this,uint dim,double *val,int len)

{
  uint uVar1;
  double dVar2;
  data *pdVar3;
  float val_00;
  range l;
  float local_48;
  linepart local_40;
  range local_38;
  
  range::range(&local_38);
  if (dim == 2) {
    pdVar3 = this->_dim + 2;
  }
  else if (dim == 1) {
    pdVar3 = this->_dim + 1;
  }
  else if (dim == 0) {
    pdVar3 = this->_dim;
  }
  else {
    pdVar3 = (data *)0x0;
  }
  local_40.raw = 0;
  local_40.usr = 0;
  local_40._cut = 0;
  local_40._trim = 0;
  if ((pdVar3 == (data *)0x0) || (uVar1 = (pdVar3->super_value_apply)._flags, (uVar1 & 0x10) == 0))
  {
    mpt_linepart_linear(&local_40,val,(long)len,0);
  }
  else {
    if ((uVar1 & 0x20) == 0) {
      local_38.min = (pdVar3->limit).min;
      local_38.max = (pdVar3->limit).max;
    }
    else {
      dVar2 = floor((pdVar3->limit).min);
      local_38.min = exp10(dVar2);
      dVar2 = ceil((pdVar3->limit).max);
      local_38.max = exp10(dVar2);
    }
    mpt_linepart_linear(&local_40,val,(long)len,&local_38);
    if (((pdVar3->super_value_apply)._flags & 0x20) != 0) {
      val_00 = linepart::cut(&local_40);
      local_48 = linepart::trim(&local_40);
      if ((val_00 != 0.0) || (NAN(val_00))) {
        dVar2 = log10((double)val_00);
        val_00 = (float)dVar2;
      }
      if ((local_48 != 0.0) || (NAN(local_48))) {
        dVar2 = log10((double)local_48);
        local_48 = (float)dVar2;
      }
      linepart::set_cut(&local_40,val_00);
      linepart::set_trim(&local_40,local_48);
    }
  }
  return local_40;
}

Assistant:

linepart layout::graph::transform3::part(unsigned dim, const double *val, int len) const
{
	struct range l;
	const data *curr = 0;
	
	switch (dim) {
		case 0: curr = &_dim[0]; break;
		case 1: curr = &_dim[1]; break;
		case 2: curr = &_dim[2]; break;
	}
	linepart lp;
	
	if (!curr
	 || !(curr->_flags & TransformLimit)) {
		mpt_linepart_linear(&lp, val, len, 0);
		return lp;
	}
	if (curr->_flags & TransformLg) {
		l.min = exp10(floor(curr->limit.min));
		l.max = exp10(ceil(curr->limit.max));
	} else {
		l = curr->limit;
	}
	mpt_linepart_linear(&lp, val, len, &l);
	
	if (curr->_flags & TransformLg) {
		double cut  = lp.cut();
		double trim = lp.trim();
		
		if (cut) cut = log10(cut);
		if (trim) trim = log10(trim);
		
		lp.set_cut(cut);
		lp.set_trim(trim);
	}
	return lp;
}